

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_element.cpp
# Opt level: O3

string * __thiscall ICM::to_string_abi_cxx11_(string *__return_storage_ptr__,ICM *this,AST *ast)

{
  undefined8 *puVar1;
  Node *node;
  undefined8 *puVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{AST:","");
  puVar1 = *(undefined8 **)(this + 8);
  if ((long)puVar1 - *(long *)this == 8) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    puVar2 = (undefined8 *)(*(long *)this + 8);
    if (puVar2 < puVar1) {
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_string_abi_cxx11_(&local_50,(ICM *)*puVar2,node);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(const AST &ast) {
		string str("{AST:");
		if (ast.empty())
			str.append("NIL");
		else {
			for (const auto &e : ast.getTableRange()) {
				str.append("\n ");
				str.append(ICM::to_string(*e));
			}
		}
		str.append("\n}");
		return str;
	}